

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase230::run(TestCase230 *this)

{
  bool bVar1;
  anon_class_8_1_5fb92151 *func;
  bool local_539;
  undefined1 auStack_538 [7];
  bool _kj_shouldLog;
  Maybe<kj::Exception> local_530;
  DebugExpression<kj::Maybe<kj::Exception>_> local_398;
  undefined1 local_200 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition;
  undefined1 local_38 [8];
  SchemaLoader loader;
  TestCase230 *this_local;
  
  loader.impl.value.ptr = (Impl *)this;
  SchemaLoader::SchemaLoader((SchemaLoader *)local_38);
  SchemaLoader::loadCompiledTypeAndDependencies<capnproto_test::capnp::test::TestListDefaults>
            ((SchemaLoader *)local_38);
  _auStack_538 = local_38;
  kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase230::run()::__0>
            (&local_530,(kj *)auStack_538,func);
  kj::_::DebugExpressionStart::operator<<
            (&local_398,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_530);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_200,
             (DebugExpression<kj::Maybe<kj::Exception>> *)&local_398,(None *)&kj::none);
  kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_398);
  kj::Maybe<kj::Exception>::~Maybe(&local_530);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_200);
  if (!bVar1) {
    local_539 = kj::_::Debug::shouldLog(ERROR);
    while (local_539 != false) {
      kj::_::Debug::
      log<char_const(&)[154],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0xea,ERROR,
                 "\"failed: expected \" \"kj::runCatchingExceptions([&]() { loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()); }) != kj::none\", _kjCondition"
                 ,(char (*) [154])
                  "failed: expected kj::runCatchingExceptions([&]() { loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()); }) != kj::none"
                 ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_200);
      local_539 = false;
    }
  }
  kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
            ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_200);
  SchemaLoader::~SchemaLoader((SchemaLoader *)local_38);
  return;
}

Assistant:

TEST(SchemaLoader, Incompatible) {
  SchemaLoader loader;
  loader.loadCompiledTypeAndDependencies<test::TestListDefaults>();
  EXPECT_NONFATAL_FAILURE(
      loadUnderAlternateTypeId<test::TestAllTypes>(loader, typeId<test::TestListDefaults>()));
}